

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

int __thiscall ImFontAtlas::AddCustomRectRegular(ImFontAtlas *this,int width,int height)

{
  undefined1 local_38 [8];
  ImFontAtlasCustomRect r;
  int height_local;
  int width_local;
  ImFontAtlas *this_local;
  
  r.Font._0_4_ = height;
  r.Font._4_4_ = width;
  if (width < 1 || 0xffff < width) {
    __assert_fail("width > 0 && width <= 0xFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0x88d,"int ImFontAtlas::AddCustomRectRegular(int, int)");
  }
  if (height < 1 || 0xffff < height) {
    __assert_fail("height > 0 && height <= 0xFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0x88e,"int ImFontAtlas::AddCustomRectRegular(int, int)");
  }
  ImFontAtlasCustomRect::ImFontAtlasCustomRect((ImFontAtlasCustomRect *)local_38);
  local_38._0_2_ = (undefined2)r.Font._4_4_;
  local_38._2_2_ = (undefined2)(int)r.Font;
  ImVector<ImFontAtlasCustomRect>::push_back(&this->CustomRects,(ImFontAtlasCustomRect *)local_38);
  return (this->CustomRects).Size + -1;
}

Assistant:

int ImFontAtlas::AddCustomRectRegular(int width, int height)
{
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    ImFontAtlasCustomRect r;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}